

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwJoystickIsGamepad(int jid)

{
  int iVar1;
  uint uVar2;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/glfw/src/input.c"
                  ,0x475,"int glfwJoystickIsGamepad(int)");
  }
  if (jid < 0x10) {
    if (_glfw.initialized == 0) {
      uVar2 = 0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else if (_glfw.joysticks[(uint)jid].present == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,0);
      if (iVar1 != 0) {
        uVar2 = (uint)(_glfw.joysticks[(uint)jid].mapping != (_GLFWmapping *)0x0);
      }
    }
    return uVar2;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/glfw/src/input.c"
                ,0x476,"int glfwJoystickIsGamepad(int)");
}

Assistant:

GLFWAPI int glfwJoystickIsGamepad(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return GLFW_FALSE;

    return js->mapping != NULL;
}